

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  _func_void_j_compress_ptr *p_Var15;
  code *pcVar16;
  _func_void_j_compress_ptr *st;
  bool bVar17;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar7 = *(uint *)&pjVar3[4].start_pass;
    if (uVar7 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar7 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar7 - 1;
  }
  paJVar4 = *MCU_data;
  uVar7 = cinfo->Se;
  uVar10 = (ulong)uVar7;
  uVar6 = (long)(int)uVar7;
  if (0 < (long)(int)uVar7) {
    do {
      uVar10 = uVar6;
      sVar1 = (*paJVar4)[jpeg_natural_order[uVar10]];
      uVar9 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar9 = -uVar9;
      }
      if (uVar9 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00133ff4;
      uVar6 = uVar10 - 1;
    } while (1 < (long)uVar10);
    uVar10 = 0;
  }
LAB_00133ff4:
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar8 = cinfo->Ss;
  if (iVar8 <= (int)uVar10) {
LAB_00134022:
    p_Var15 = (&pjVar3[9].finish_pass)[iVar2];
    lVar12 = (long)(iVar8 * 3 + -3);
    arith_encode(cinfo,(uchar *)(p_Var15 + lVar12),0);
    piVar14 = jpeg_natural_order + iVar8;
    p_Var15 = p_Var15 + lVar12 + 1;
    iVar11 = iVar8;
    do {
      sVar1 = (*paJVar4)[*piVar14];
      uVar7 = (uint)sVar1;
      if (sVar1 < 0) {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar9 = -uVar7 >> bVar5;
        if (-uVar7 >> bVar5 != 0) {
          iVar8 = 1;
          goto LAB_001340ac;
        }
      }
      else {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar9 = uVar7 >> bVar5;
        if (uVar7 >> bVar5 != 0) goto LAB_001340a1;
      }
      arith_encode(cinfo,(uchar *)p_Var15,0);
      iVar11 = iVar11 + 1;
      piVar14 = piVar14 + 1;
      p_Var15 = p_Var15 + 3;
    } while( true );
  }
LAB_001341d9:
  if (iVar8 <= (int)uVar7) {
    arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar8 * 3 + -3)),1);
  }
  return 1;
LAB_001340a1:
  iVar8 = 0;
LAB_001340ac:
  arith_encode(cinfo,(uchar *)p_Var15,1);
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),iVar8);
  pcVar16 = p_Var15 + 1;
  uVar7 = uVar9 - 1;
  if ((uVar7 == 0) || (arith_encode(cinfo,(uchar *)pcVar16,1), uVar7 == 1)) {
    arith_encode(cinfo,(uchar *)pcVar16,0);
  }
  else {
    arith_encode(cinfo,(uchar *)pcVar16,1);
    lVar12 = 0xbd;
    if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar11) {
      lVar12 = 0xd9;
    }
    p_Var15 = (&pjVar3[9].finish_pass)[iVar2] + lVar12;
    if (uVar9 < 5) {
      arith_encode(cinfo,(uchar *)p_Var15,0);
      pcVar16 = p_Var15 + 0xe;
      uVar9 = 2;
    }
    else {
      uVar9 = 2;
      uVar13 = uVar7;
      do {
        st = p_Var15;
        arith_encode(cinfo,(uchar *)st,1);
        uVar9 = uVar9 * 2;
        bVar17 = 7 < uVar13;
        p_Var15 = st + 1;
        uVar13 = uVar13 >> 1;
      } while (bVar17);
      arith_encode(cinfo,(uchar *)(st + 1),0);
      if (uVar9 == 0) goto LAB_001341ba;
      pcVar16 = st + 0xf;
    }
    do {
      uVar9 = (int)uVar9 >> 1;
      arith_encode(cinfo,(uchar *)pcVar16,(uint)((uVar9 & uVar7) != 0));
    } while (1 < uVar9);
  }
LAB_001341ba:
  iVar8 = iVar11 + 1;
  if ((int)uVar10 <= iVar11) goto code_r0x001341cd;
  goto LAB_00134022;
code_r0x001341cd:
  uVar7 = cinfo->Se;
  iVar8 = iVar11 + 1;
  goto LAB_001341d9;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);         /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 0);
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 1);
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
        arith_encode(cinfo, st, 1);
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}